

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void build_paths_internal(ZNode *z,VecVecZNode *paths,int parent,int n,int n_to_go)

{
  uint uVar1;
  ZNode **ppZVar2;
  int n_00;
  SNode *pSVar3;
  VecZNode *pVVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  pVVar4 = paths->v[parent];
  ppZVar2 = pVVar4->v;
  if (ppZVar2 == (ZNode **)0x0) {
    pVVar4->v = pVVar4->e;
    uVar1 = paths->v[parent]->n;
    paths->v[parent]->n = uVar1 + 1;
    pVVar4->e[uVar1] = z;
    goto LAB_001468f8;
  }
  uVar1 = pVVar4->n;
  if (ppZVar2 == pVVar4->e) {
    if (2 < uVar1) goto LAB_001468f0;
  }
  else if ((uVar1 & 7) == 0) {
LAB_001468f0:
    vec_add_internal(pVVar4,z);
    goto LAB_001468f8;
  }
  pVVar4->n = uVar1 + 1;
  ppZVar2[uVar1] = z;
LAB_001468f8:
  if ((1 < n_to_go) && ((z->sns).n != 0)) {
    n_00 = (n - n_to_go) + 1;
    uVar7 = 0;
    do {
      pSVar3 = (z->sns).v[uVar7];
      if ((pSVar3->zns).n != 0) {
        uVar6 = 0;
        iVar5 = 0;
        do {
          if ((pSVar3->zns).v[uVar6] != (ZNode *)0x0) {
            if (uVar7 != (uint)-iVar5) {
              if (paths->v == (VecZNode **)0x0) {
                pVVar4 = new_VecZNode(paths,n_00,parent);
                paths->v = paths->e;
                uVar1 = paths->n;
                paths->n = uVar1 + 1;
                paths->e[uVar1] = pVVar4;
              }
              else {
                if (paths->v == paths->e) {
                  if (2 < paths->n) goto LAB_001469c2;
                }
                else if ((paths->n & 7) == 0) {
LAB_001469c2:
                  pVVar4 = new_VecZNode(paths,n_00,parent);
                  vec_add_internal(paths,pVVar4);
                  goto LAB_001469dc;
                }
                pVVar4 = new_VecZNode(paths,n_00,parent);
                uVar1 = paths->n;
                paths->n = uVar1 + 1;
                paths->v[uVar1] = pVVar4;
              }
LAB_001469dc:
              parent = paths->n - 1;
            }
            build_paths_internal(((z->sns).v[uVar7]->zns).v[uVar6],paths,parent,n,n_to_go + -1);
            iVar5 = iVar5 + 1;
          }
          uVar6 = uVar6 + 1;
          pSVar3 = (z->sns).v[uVar7];
        } while (uVar6 < (pSVar3->zns).n);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (z->sns).n);
  }
  return;
}

Assistant:

static void build_paths_internal(ZNode *z, VecVecZNode *paths, int parent, int n, int n_to_go) {
  uint j, k, l;

  vec_add(paths->v[parent], z);
  if (n_to_go <= 1) return;
  for (k = 0; k < z->sns.n; k++)
    for (j = 0, l = 0; j < z->sns.v[k]->zns.n; j++) {
      if (z->sns.v[k]->zns.v[j]) {
        if (k + l) {
          vec_add(paths, new_VecZNode(paths, n - (n_to_go - 1), parent));
          parent = paths->n - 1;
        }
        build_paths_internal(z->sns.v[k]->zns.v[j], paths, parent, n, n_to_go - 1);
        l++;
      }
    }
}